

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O2

void MT32Emu::muteStreams<float>(DACOutputStreams<float> *streams,Bit32u len)

{
  Synth::muteSampleBuffer(streams->nonReverbLeft,len);
  Synth::muteSampleBuffer(streams->nonReverbRight,len);
  Synth::muteSampleBuffer(streams->reverbDryLeft,len);
  Synth::muteSampleBuffer(streams->reverbDryRight,len);
  Synth::muteSampleBuffer(streams->reverbWetLeft,len);
  Synth::muteSampleBuffer(streams->reverbWetRight,len);
  return;
}

Assistant:

static inline void muteStreams(const DACOutputStreams<Sample> &streams, Bit32u len) {
	Synth::muteSampleBuffer(streams.nonReverbLeft, len);
	Synth::muteSampleBuffer(streams.nonReverbRight, len);
	Synth::muteSampleBuffer(streams.reverbDryLeft, len);
	Synth::muteSampleBuffer(streams.reverbDryRight, len);
	Synth::muteSampleBuffer(streams.reverbWetLeft, len);
	Synth::muteSampleBuffer(streams.reverbWetRight, len);
}